

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e_des.cc
# Opt level: O0

int des_ecb_cipher(EVP_CIPHER_CTX *ctx,uint8_t *out,uint8_t *in,size_t in_len)

{
  uint uVar1;
  DES_key_schedule *schedule;
  ulong local_40;
  size_t i;
  EVP_DES_KEY *dat;
  size_t in_len_local;
  uint8_t *in_local;
  uint8_t *out_local;
  EVP_CIPHER_CTX *ctx_local;
  
  if (ctx->cipher->block_size <= in_len) {
    uVar1 = ctx->cipher->block_size;
    schedule = (DES_key_schedule *)ctx->cipher_data;
    for (local_40 = 0; local_40 <= in_len - uVar1; local_40 = ctx->cipher->block_size + local_40) {
      DES_ecb_encrypt_ex(in + local_40,out + local_40,schedule,ctx->encrypt);
    }
  }
  return 1;
}

Assistant:

static int des_ecb_cipher(EVP_CIPHER_CTX *ctx, uint8_t *out, const uint8_t *in,
                          size_t in_len) {
  if (in_len < ctx->cipher->block_size) {
    return 1;
  }
  in_len -= ctx->cipher->block_size;

  EVP_DES_KEY *dat = (EVP_DES_KEY *)ctx->cipher_data;
  for (size_t i = 0; i <= in_len; i += ctx->cipher->block_size) {
    DES_ecb_encrypt_ex(in + i, out + i, &dat->ks.ks, ctx->encrypt);
  }
  return 1;
}